

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  byte bVar1;
  TextGenerator generator;
  BaseTextGenerator local_38;
  ZeroCopyOutputStream *local_30;
  undefined8 local_28;
  uint local_20;
  undefined2 local_1c;
  undefined1 local_1a;
  int local_18;
  int local_14;
  
  local_18 = this->initial_indent_level_;
  local_38._vptr_BaseTextGenerator = (_func_int **)&PTR__TextGenerator_00463078;
  local_28 = 0;
  local_20 = 0;
  local_1c = 1;
  local_1a = 0;
  local_30 = output;
  local_14 = local_18;
  PrintUnknownFields(this,unknown_fields,&local_38,10);
  bVar1 = local_1c._1_1_;
  local_38._vptr_BaseTextGenerator = (_func_int **)&PTR__TextGenerator_00463078;
  if (local_1c._1_1_ == 0) {
    (*local_30->_vptr_ZeroCopyOutputStream[3])(local_30,(ulong)local_20);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields,
    io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, initial_indent_level_);

  PrintUnknownFields(unknown_fields, &generator, kUnknownFieldRecursionLimit);

  // Output false if the generator failed internally.
  return !generator.failed();
}